

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeHelpers.cpp
# Opt level: O0

double __thiscall UnitTest::Timer::GetTimeInMs(Timer *this)

{
  double dus;
  double dsecs;
  timeval currentTime;
  Timer *this_local;
  
  currentTime.tv_usec = (__suseconds_t)this;
  gettimeofday((timeval *)&dsecs,(__timezone_ptr_t)0x0);
  return (double)((long)dsecs - (this->m_startTime).tv_sec) * 1000.0 +
         (double)(currentTime.tv_sec - (this->m_startTime).tv_usec) / 1000.0;
}

Assistant:

double Timer::GetTimeInMs() const
{
    struct timeval currentTime;
    gettimeofday(&currentTime, 0);

	double const dsecs = currentTime.tv_sec - m_startTime.tv_sec;
    double const dus = currentTime.tv_usec - m_startTime.tv_usec;

	return (dsecs * 1000.0) + (dus / 1000.0);
}